

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O1

_Bool init_ucs(unicode_data *ucsdata,char *linecharset,_Bool utf8_override,wchar_t font_charset,
              wchar_t vtmode)

{
  wchar_t wVar1;
  wchar_t awVar2 [1];
  char *pcVar3;
  wchar_t *pwVar4;
  uchar uVar5;
  wchar_t *pwVar6;
  undefined7 in_register_00000011;
  wchar_t *pwVar7;
  long lVar8;
  char c [1];
  wchar_t len;
  wchar_t wc [1];
  char *p;
  wchar_t local_34;
  
  ucsdata->font_codepage = L'\xffffffff';
  ucsdata->line_codepage = L'\0';
  if ((((int)CONCAT71(in_register_00000011,utf8_override) != 0) &&
      ((((pcVar3 = getenv("LC_ALL"), pcVar3 != (char *)0x0 && (*pcVar3 != '\0')) ||
        ((pcVar3 = getenv("LC_CTYPE"), pcVar3 != (char *)0x0 && (*pcVar3 != '\0')))) ||
       ((pcVar3 = getenv("LANG"), pcVar3 != (char *)0x0 && (*pcVar3 != '\0')))))) &&
     (pcVar3 = strstr(pcVar3,"UTF-8"), pcVar3 != (char *)0x0)) {
    ucsdata->line_codepage = L'7';
  }
  if (ucsdata->line_codepage == L'\0') {
    wVar1 = L'7';
    if ((linecharset != (char *)0x0) && (*linecharset != '\0')) {
      wVar1 = charset_from_localenc(linecharset);
    }
    ucsdata->line_codepage = wVar1;
  }
  if (ucsdata->line_codepage == L'\0') {
    ucsdata->line_codepage = font_charset;
  }
  local_34 = ucsdata->line_codepage;
  lVar8 = 0;
  do {
    c[0] = (char)lVar8;
    len = L'\x01';
    if (ucsdata->line_codepage == L'\0') {
      awVar2[0] = (uint)lVar8 | 0xd800;
LAB_0010694c:
      ucsdata->unitab_line[lVar8] = awVar2[0];
    }
    else {
      p = c;
      wVar1 = charset_to_unicode(&p,&len,wc,L'\x01',ucsdata->line_codepage,(charset_state *)0x0,
                                 anon_var_dwarf_6b7e + 6,L'\0');
      awVar2[0] = wc[0];
      if (wVar1 == L'\x01') goto LAB_0010694c;
      ucsdata->unitab_line[lVar8] = L'�';
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x100) {
      pwVar4 = ucsdata->unitab_line;
      pwVar6 = 
      L"♦▒␉␌␍␊°±␤␋┘┐┌└┼⎺⎻─⎼⎽├┤┴┬│≤≥π≠£· ";
      if (vtmode == L'\x03') {
        pwVar6 = L"*#****o~**+++++-----++++|****L. ";
      }
      lVar8 = 0;
      do {
        pwVar7 = pwVar6 + ((uint)lVar8 & 0x1f);
        if (0x1f < (uint)lVar8 - 0x5f) {
          pwVar7 = pwVar4;
        }
        ucsdata->unitab_xterm[lVar8] = *pwVar7;
        lVar8 = lVar8 + 1;
        pwVar4 = pwVar4 + 1;
      } while (lVar8 != 0x100);
      lVar8 = 0;
      do {
        c[0] = (char)lVar8;
        len = L'\x01';
        p = c;
        wVar1 = charset_to_unicode(&p,&len,wc,L'\x01',L'\x11',(charset_state *)0x0,
                                   anon_var_dwarf_6b7e + 6,L'\0');
        awVar2[0] = L'�';
        if (wVar1 == L'\x01') {
          awVar2[0] = wc[0];
        }
        ucsdata->unitab_scoacs[lVar8] = awVar2[0];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
      lVar8 = 0;
      do {
        wVar1 = ucsdata->unitab_line[lVar8];
        if (((uint)(wVar1 + L'\xffffff81') < 0x21 || wVar1 < L' ') ||
           (uVar5 = 0xff, wVar1 == L'\xd87f' || (wVar1 & 0x7fffffe0U) == 0xd800)) {
          uVar5 = (uchar)lVar8;
        }
        ucsdata->unitab_ctrl[lVar8] = uVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
      return local_34 == L'\0';
    }
  } while( true );
}

Assistant:

bool init_ucs(struct unicode_data *ucsdata, char *linecharset,
              bool utf8_override, int font_charset, int vtmode)
{
    int i;
    bool ret = false;

    /*
     * In the platform-independent parts of the code, font_codepage
     * is used only for system DBCS support - which we don't
     * support at all. So we set this to something which will never
     * be used.
     */
    ucsdata->font_codepage = -1;

    /*
     * If utf8_override is set and the POSIX locale settings
     * dictate a UTF-8 character set, then just go straight for
     * UTF-8.
     */
    ucsdata->line_codepage = CS_NONE;
    if (utf8_override) {
        const char *s;
        if (((s = getenv("LC_ALL"))   && *s) ||
            ((s = getenv("LC_CTYPE")) && *s) ||
            ((s = getenv("LANG"))     && *s)) {
            if (strstr(s, "UTF-8"))
                ucsdata->line_codepage = CS_UTF8;
        }
    }

    /*
     * Failing that, line_codepage should be decoded from the
     * specification in conf.
     */
    if (ucsdata->line_codepage == CS_NONE)
        ucsdata->line_codepage = decode_codepage(linecharset);

    /*
     * If line_codepage is _still_ CS_NONE, we assume we're using
     * the font's own encoding. This has been passed in to us, so
     * we use that. If it's still CS_NONE after _that_ - i.e. the
     * font we were given had an incomprehensible charset - then we
     * fall back to using the D800 page.
     */
    if (ucsdata->line_codepage == CS_NONE)
        ucsdata->line_codepage = font_charset;

    if (ucsdata->line_codepage == CS_NONE)
        ret = true;

    /*
     * Set up unitab_line, by translating each individual character
     * in the line codepage into Unicode.
     */
    for (i = 0; i < 256; i++) {
        char c[1];
        const char *p;
        wchar_t wc[1];
        int len;
        c[0] = i;
        p = c;
        len = 1;
        if (ucsdata->line_codepage == CS_NONE)
            ucsdata->unitab_line[i] = 0xD800 | i;
        else if (1 == charset_to_unicode(&p, &len, wc, 1,
                                         ucsdata->line_codepage,
                                         NULL, L"", 0))
            ucsdata->unitab_line[i] = wc[0];
        else
            ucsdata->unitab_line[i] = 0xFFFD;
    }

    /*
     * Set up unitab_xterm. This is the same as unitab_line except
     * in the line-drawing regions, where it follows the Unicode
     * encoding.
     *
     * (Note that the strange X encoding of line-drawing characters
     * in the bottom 32 glyphs of ISO8859-1 fonts is taken care of
     * by the font encoding, which will spot such a font and act as
     * if it were in a variant encoding of ISO8859-1.)
     */
    for (i = 0; i < 256; i++) {
        static const wchar_t unitab_xterm_std[32] = {
            0x2666, 0x2592, 0x2409, 0x240c, 0x240d, 0x240a, 0x00b0, 0x00b1,
            0x2424, 0x240b, 0x2518, 0x2510, 0x250c, 0x2514, 0x253c, 0x23ba,
            0x23bb, 0x2500, 0x23bc, 0x23bd, 0x251c, 0x2524, 0x2534, 0x252c,
            0x2502, 0x2264, 0x2265, 0x03c0, 0x2260, 0x00a3, 0x00b7, 0x0020
        };
        static const wchar_t unitab_xterm_poorman[32] =
            L"*#****o~**+++++-----++++|****L. ";

        const wchar_t *ptr;

        if (vtmode == VT_POORMAN)
            ptr = unitab_xterm_poorman;
        else
            ptr = unitab_xterm_std;

        if (i >= 0x5F && i < 0x7F)
            ucsdata->unitab_xterm[i] = ptr[i & 0x1F];
        else
            ucsdata->unitab_xterm[i] = ucsdata->unitab_line[i];
    }

    /*
     * Set up unitab_scoacs. The SCO Alternate Character Set is
     * simply CP437.
     */
    for (i = 0; i < 256; i++) {
        char c[1];
        const char *p;
        wchar_t wc[1];
        int len;
        c[0] = i;
        p = c;
        len = 1;
        if (1 == charset_to_unicode(&p, &len, wc, 1, CS_CP437, NULL, L"", 0))
            ucsdata->unitab_scoacs[i] = wc[0];
        else
            ucsdata->unitab_scoacs[i] = 0xFFFD;
    }

    /*
     * Find the control characters in the line codepage. For
     * direct-to-font mode using the D800 hack, we assume 00-1F and
     * 7F are controls, but allow 80-9F through. (It's as good a
     * guess as anything; and my bet is that half the weird fonts
     * used in this way will be IBM or MS code pages anyway.)
     */
    for (i = 0; i < 256; i++) {
        int lineval = ucsdata->unitab_line[i];
        if (lineval < ' ' || (lineval >= 0x7F && lineval < 0xA0) ||
            (lineval >= 0xD800 && lineval < 0xD820) || (lineval == 0xD87F))
            ucsdata->unitab_ctrl[i] = i;
        else
            ucsdata->unitab_ctrl[i] = 0xFF;
    }

    return ret;
}